

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

int32_t __thiscall AmpIO::ReadWatchdogPeriod(AmpIO *this,bool applyMask)

{
  BasePort *pBVar1;
  uint32_t counts;
  uint local_c;
  
  local_c = 0;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 != (BasePort *)0x0) {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,&local_c);
  }
  if (applyMask) {
    local_c = local_c & 0xffff;
  }
  return local_c;
}

Assistant:

int32_t AmpIO::ReadWatchdogPeriod(bool applyMask) const
{
    uint32_t counts = 0;
    if (port) {
        port->ReadQuadlet(BoardId, 3, counts);
    }
    if (applyMask)
        counts &= 0x0000ffff;
    return counts;
}